

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

token * parse_enum_declaration(dmr_C *C,token *token,symbol *parent)

{
  byte *pbVar1;
  allocator *alloc;
  allocator *A;
  symbol *psVar2;
  position pVar3;
  int iVar4;
  expression *peVar6;
  symbol *sym;
  global_symbols_t *pgVar7;
  ptr_list *ppVar8;
  void *pvVar9;
  byte bVar10;
  byte bVar11;
  ptr_list *ppVar12;
  ptr_list *ppVar13;
  char cVar14;
  int iVar15;
  ptr_list *newtype;
  bool bVar16;
  ptr_list *local_88;
  expression *expr;
  dmr_C *local_70;
  ptr_list *local_68;
  expression *local_60;
  int local_54;
  position local_50;
  expression *local_48;
  expression *local_40;
  int local_34;
  uint uVar5;
  
  pbVar1 = (byte *)((long)&parent->field_14 + 0xe);
  *pbVar1 = *pbVar1 | 0x10;
  (parent->field_14).field_2.ctype.base_type = &C->S->int_ctype;
  if ((SUB84(token->pos,0) & 0x3f) == 2) {
    A = &C->expression_allocator;
    alloc = &C->ptrlist_allocator;
    local_34 = 1;
    newtype = (ptr_list *)0x0;
    ppVar8 = (ptr_list *)0x0;
    local_48 = (expression *)0x0;
    local_40 = (expression *)0x0;
    peVar6 = (expression *)0x0;
    local_70 = C;
    local_68 = (ptr_list *)parent;
    iVar15 = -1;
    do {
      local_54 = iVar15;
      local_88 = (ptr_list *)0x0;
      pVar3 = *(position *)((long)token + 8);
      if (((*(uint *)pVar3 & 0x3f) == 0x11) && (*(uint *)((long)pVar3 + 0x10) == 0x3d)) {
        local_50 = (position)
                   dmrC_conditional_expression
                             (C,*(token **)((long)pVar3 + 8),(expression **)&stack0xffffffffffffff78
                             );
        peVar6 = (expression *)dmrC_get_expression_value(C,(expression *)local_88);
        pgVar7 = C->S;
        ppVar8 = (ptr_list *)&pgVar7->void_ctype;
        if (local_88 == (ptr_list *)0x0) goto LAB_0011aaeb;
        local_60 = peVar6;
        if (local_88->next_ != (ptr_list *)0x0) {
          ppVar8 = local_88->next_;
        }
      }
      else {
        local_50 = pVar3;
        if (ppVar8 == (ptr_list *)0x0) {
          ppVar8 = (ptr_list *)&C->S->int_ctype;
        }
        else {
          cVar14 = *(char *)ppVar8;
          ppVar13 = ppVar8;
          if (cVar14 == '\x03') {
            ppVar13 = (ptr_list *)ppVar8->list_[0xc];
            cVar14 = *(char *)ppVar13;
          }
          if (cVar14 == '\t') {
            ppVar13 = (ptr_list *)ppVar13->list_[0xc];
            cVar14 = *(char *)ppVar13;
          }
          if ((cVar14 != '\r') && ((symbol *)ppVar13->list_[0xc] != &C->S->int_type)) {
            dmrC_error_die(local_70,token->pos,"can\'t increment the last enum member");
          }
          peVar6 = (expression *)&peVar6->field_0x1;
        }
LAB_0011aaeb:
        pVar3 = token->pos;
        local_88 = (ptr_list *)dmrC_allocator_allocate(A,0);
        *(undefined1 *)local_88 = 1;
        *(position *)&local_88->prev_ = pVar3;
        (((anon_union_32_18_55d8ca1e_for_expression_5 *)local_88->list_)->field_3).unop = peVar6;
        local_88->next_ = ppVar8;
        pgVar7 = local_70->S;
        C = local_70;
        local_60 = peVar6;
      }
      sym = dmrC_alloc_symbol(pgVar7,token->pos,3);
      dmrC_bind_symbol(C->S,sym,*(ident **)((long)token + 0x10),NS_SYMBOL);
      pbVar1 = (byte *)((long)&sym->field_14 + 0x1a);
      *pbVar1 = *pbVar1 & 0xf7;
      (sym->field_14).field_2.initializer = (expression *)local_88;
      sym->field_0x2 = sym->field_0x2 | 0x10;
      (sym->field_14).field_2.ctype.base_type = (symbol *)local_68;
      ptrlist_add((ptr_list **)&(parent->field_14).field_2.symbol_list,sym,alloc);
      pgVar7 = C->S;
      psVar2 = &pgVar7->bad_ctype;
      if (newtype != (ptr_list *)psVar2) {
        cVar14 = *(char *)ppVar8;
        ppVar13 = ppVar8;
        if (cVar14 == '\x03') {
          ppVar13 = (ptr_list *)ppVar8->list_[0xc];
          cVar14 = *(char *)ppVar13;
        }
        ppVar8 = ppVar13;
        if ((cVar14 == '\t') && (ppVar8 = newtype, ppVar13 != local_68)) {
          ppVar8 = (ptr_list *)ppVar13->list_[0xc];
        }
        ppVar13 = ppVar8;
        if ((newtype != (ptr_list *)0x0) && (ppVar13 = newtype, ppVar8 != newtype)) {
          cVar14 = *(char *)newtype;
          ppVar12 = newtype;
          if (cVar14 == '\x03') {
            ppVar12 = (ptr_list *)newtype->list_[0xc];
            cVar14 = *(char *)ppVar12;
          }
          if (cVar14 == '\t') {
            ppVar12 = (ptr_list *)ppVar12->list_[0xc];
            cVar14 = *(char *)ppVar12;
          }
          ppVar13 = (ptr_list *)psVar2;
          if ((cVar14 == '\r') || ((symbol *)ppVar12->list_[0xc] == &pgVar7->int_type)) {
            cVar14 = *(char *)ppVar8;
            ppVar12 = ppVar8;
            if (cVar14 == '\x03') {
              ppVar12 = (ptr_list *)ppVar8->list_[0xc];
              cVar14 = *(char *)ppVar12;
            }
            if (cVar14 == '\t') {
              ppVar12 = (ptr_list *)ppVar12->list_[0xc];
              cVar14 = *(char *)ppVar12;
            }
            if ((cVar14 == '\r') || ((symbol *)ppVar12->list_[0xc] == &pgVar7->int_type)) {
              ppVar12 = ppVar8;
              if ((*(int *)(ppVar8->list_ + 6) <= *(int *)(newtype->list_ + 6)) &&
                 ((ppVar12 = newtype, *(int *)(newtype->list_ + 6) == *(int *)(ppVar8->list_ + 6) &&
                  ((*(byte *)(ppVar8->list_ + 8) & 0x80) != 0)))) {
                ppVar12 = ppVar8;
              }
              ppVar13 = (ptr_list *)&pgVar7->int_ctype;
              if (C->target->bits_in_int <= *(int *)(ppVar12->list_ + 6)) {
                ppVar13 = ppVar12;
              }
            }
          }
        }
        local_68->list_[0xc] = ppVar13;
        pgVar7 = C->S;
        newtype = ppVar13;
      }
      cVar14 = *(char *)newtype;
      ppVar13 = newtype;
      if (cVar14 == '\x03') {
        ppVar13 = (ptr_list *)newtype->list_[0xc];
        cVar14 = *(char *)ppVar13;
      }
      if (cVar14 == '\t') {
        ppVar13 = (ptr_list *)ppVar13->list_[0xc];
        cVar14 = *(char *)ppVar13;
      }
      iVar15 = local_54;
      if ((cVar14 == '\r') || ((symbol *)ppVar13->list_[0xc] == &pgVar7->int_type)) {
        uVar5 = (uint)((long)local_60 < 0 && (*(byte *)(ppVar8->list_ + 8) & 0x80) == 0);
        iVar4 = -uVar5;
        bVar16 = (int)(local_54 + uVar5) < 0;
        peVar6 = local_48;
        if ((local_54 == iVar4 || SBORROW4(local_54,iVar4) != bVar16) &&
           ((peVar6 = local_60, iVar15 = iVar4, SBORROW4(local_54,iVar4) == bVar16 &&
            (peVar6 = local_48, iVar15 = local_54, local_48 <= local_60)))) {
          peVar6 = local_60;
        }
        bVar16 = (int)(local_34 + uVar5) < 0;
        local_48 = peVar6;
        if (SBORROW4(local_34,iVar4) == bVar16) {
          if (local_34 == iVar4 || SBORROW4(local_34,iVar4) != bVar16) {
            if (local_60 <= local_40) {
              local_40 = local_60;
            }
          }
          else {
            local_40 = local_60;
            local_34 = iVar4;
          }
        }
      }
      sym->endpos = *(position *)local_50;
      token = (token *)local_50;
    } while ((((*(uint *)local_50 & 0x3f) == 0x11) && (*(uint *)((long)local_50 + 0x10) == 0x2c)) &&
            (token = *(token **)((long)local_50 + 8), peVar6 = local_60,
            (*(uint *)token & 0x3f) == 2));
    cVar14 = *(char *)newtype;
    ppVar8 = newtype;
    if (cVar14 == '\x03') {
      ppVar8 = (ptr_list *)newtype->list_[0xc];
      cVar14 = *(char *)ppVar8;
    }
    if (cVar14 == '\t') {
      ppVar8 = (ptr_list *)ppVar8->list_[0xc];
      cVar14 = *(char *)ppVar8;
    }
    pgVar7 = C->S;
    parent = (symbol *)local_68;
    if ((cVar14 == '\r') || ((symbol *)ppVar8->list_[0xc] == &pgVar7->int_type)) {
      bVar10 = (byte)*(undefined4 *)(newtype->list_ + 6);
      bVar11 = bVar10 - 1;
      cVar14 = (char)newtype->list_[8];
      if (-1 < cVar14) {
        bVar10 = bVar11;
      }
      if (((iVar15 == 0) && ((ulong)local_48 >> (bVar10 & 0x3f) != 0)) ||
         ((local_34 != 0 && ((cVar14 < '\0' || (~(ulong)local_40 >> (bVar11 & 0x3f) != 0)))))) {
        bVar10 = (byte)(pgVar7->int_ctype).field_14.field_1.normal;
        bVar11 = bVar10 - 1;
        cVar14 = (char)(pgVar7->int_ctype).field_14.field_2.ctype.modifiers;
        if (-1 < cVar14) {
          bVar10 = bVar11;
        }
        if (((iVar15 == 0) && ((ulong)local_48 >> (bVar10 & 0x3f) != 0)) ||
           ((newtype = (ptr_list *)&pgVar7->int_ctype, local_34 != 0 &&
            ((cVar14 < '\0' || (~(ulong)local_40 >> (bVar11 & 0x3f) != 0)))))) {
          bVar10 = (byte)(pgVar7->uint_ctype).field_14.field_1.normal;
          bVar11 = bVar10 - 1;
          cVar14 = (char)(pgVar7->uint_ctype).field_14.field_2.ctype.modifiers;
          if (-1 < cVar14) {
            bVar10 = bVar11;
          }
          if (((iVar15 == 0) && ((ulong)local_48 >> (bVar10 & 0x3f) != 0)) ||
             ((newtype = (ptr_list *)&pgVar7->uint_ctype, local_34 != 0 &&
              ((cVar14 < '\0' || (~(ulong)local_40 >> (bVar11 & 0x3f) != 0)))))) {
            bVar10 = (byte)(pgVar7->long_ctype).field_14.field_1.normal;
            bVar11 = bVar10 - 1;
            cVar14 = (char)(pgVar7->long_ctype).field_14.field_2.ctype.modifiers;
            if (-1 < cVar14) {
              bVar10 = bVar11;
            }
            if (((iVar15 == 0) && ((ulong)local_48 >> (bVar10 & 0x3f) != 0)) ||
               ((newtype = (ptr_list *)&pgVar7->long_ctype, local_34 != 0 &&
                ((cVar14 < '\0' || (~(ulong)local_40 >> (bVar11 & 0x3f) != 0)))))) {
              bVar10 = (byte)(pgVar7->ulong_ctype).field_14.field_1.normal;
              bVar11 = bVar10 - 1;
              cVar14 = (char)(pgVar7->ulong_ctype).field_14.field_2.ctype.modifiers;
              if (-1 < cVar14) {
                bVar10 = bVar11;
              }
              if (((iVar15 == 0) && ((ulong)local_48 >> (bVar10 & 0x3f) != 0)) ||
                 ((newtype = (ptr_list *)&pgVar7->ulong_ctype, local_34 != 0 &&
                  ((cVar14 < '\0' || (~(ulong)local_40 >> (bVar11 & 0x3f) != 0)))))) {
                bVar10 = (byte)(pgVar7->llong_ctype).field_14.field_1.normal;
                bVar11 = bVar10 - 1;
                cVar14 = (char)(pgVar7->llong_ctype).field_14.field_2.ctype.modifiers;
                if (-1 < cVar14) {
                  bVar10 = bVar11;
                }
                if (((iVar15 == 0) && ((ulong)local_48 >> (bVar10 & 0x3f) != 0)) ||
                   ((newtype = (ptr_list *)&pgVar7->llong_ctype, local_34 != 0 &&
                    ((cVar14 < '\0' || (~(ulong)local_40 >> (bVar11 & 0x3f) != 0)))))) {
                  bVar11 = (byte)(pgVar7->ullong_ctype).field_14.field_1.normal;
                  bVar10 = bVar11 - 1;
                  cVar14 = (char)(pgVar7->ullong_ctype).field_14.field_2.ctype.modifiers;
                  if (-1 < cVar14) {
                    bVar11 = bVar10;
                  }
                  if (((iVar15 == 0) && ((ulong)local_48 >> (bVar11 & 0x3f) != 0)) ||
                     ((newtype = (ptr_list *)&pgVar7->ullong_ctype, local_34 != 0 &&
                      ((cVar14 < '\0' || (~(ulong)local_40 >> (bVar10 & 0x3f) != 0)))))) {
                    newtype = (ptr_list *)&pgVar7->bad_ctype;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    dmrC_sparse_error(C,token->pos,"bad enum definition");
    newtype = (ptr_list *)&C->S->bad_ctype;
  }
  ((ptr_list *)parent)->list_[0xc] = newtype;
  ((ptr_list *)parent)->list_[8] =
       (void *)((ulong)((ptr_list *)parent)->list_[8] | (ulong)newtype->list_[8] & 0x80);
  pbVar1 = (byte *)((long)((ptr_list *)parent)->list_ + 0x36);
  *pbVar1 = *pbVar1 & 0xef;
  ptrlist_forward_iterator
            ((ptr_list_iter *)&stack0xffffffffffffff78,(ptr_list *)((ptr_list *)parent)->list_[0xf])
  ;
  while (pvVar9 = ptrlist_iter_next((ptr_list_iter *)&stack0xffffffffffffff78),
        pvVar9 != (void *)0x0) {
    peVar6 = *(expression **)((long)pvVar9 + 0xb0);
    if ((*(char *)peVar6 == '\x01') &&
       ((peVar6->ctype->field_14).field_1.normal != *(int *)(newtype->list_ + 6))) {
      dmrC_cast_value(C,peVar6,(symbol *)newtype,peVar6,peVar6->ctype);
    }
  }
  return (token *)(position)token;
}

Assistant:

static struct token *parse_enum_declaration(struct dmr_C *C, struct token *token, struct symbol *parent)
{
	unsigned long long lastval = 0;
	struct symbol *ctype = NULL, *base_type = NULL;
	Num upper = {-1, 0}, lower = {1, 0};

	parent->examined = 1;
	parent->ctype.base_type = &C->S->int_ctype;
	while (dmrC_token_type(token) == TOKEN_IDENT) {
		struct expression *expr = NULL;
		struct token *next = token->next;
		struct symbol *sym;

		if (dmrC_match_op(next, '=')) {
			next = dmrC_constant_expression(C, next->next, &expr);
			lastval = dmrC_get_expression_value(C, expr);
			ctype = &C->S->void_ctype;
			if (expr && expr->ctype)
				ctype = expr->ctype;
		} else if (!ctype) {
			ctype = &C->S->int_ctype;
		} else if (dmrC_is_int_type(C->S, ctype)) {
			lastval++;
		} else {
			dmrC_error_die(C, token->pos, "can't increment the last enum member");
		}

		if (!expr) {
			expr = dmrC_alloc_expression(C, token->pos, EXPR_VALUE);
			expr->value = lastval;
			expr->ctype = ctype;
		}

		sym = dmrC_alloc_symbol(C->S, token->pos, SYM_NODE);
		dmrC_bind_symbol(C->S, sym, token->ident, NS_SYMBOL);
		sym->ctype.modifiers &= ~MOD_ADDRESSABLE;
		sym->initializer = expr;
		sym->enum_member = 1;
		sym->ctype.base_type = parent;
		dmrC_add_symbol(C, &parent->symbol_list, sym);

		if (base_type != &C->S->bad_ctype) {
			if (ctype->type == SYM_NODE)
				ctype = ctype->ctype.base_type;
			if (ctype->type == SYM_ENUM) {
				if (ctype == parent)
					ctype = base_type;
				else 
					ctype = ctype->ctype.base_type;
			}
			/*
			 * base_type rules:
			 *  - if all enums are of the same type, then
			 *    the base_type is that type (two first
			 *    cases)
			 *  - if enums are of different types, they
			 *    all have to be integer types, and the
			 *    base type is at least "int_ctype".
			 *  - otherwise the base_type is "bad_ctype".
			 */
			if (!base_type) {
				base_type = ctype;
			} else if (ctype == base_type) {
				/* nothing */
			} else if (dmrC_is_int_type(C->S, base_type) && dmrC_is_int_type(C->S, ctype)) {
				base_type = bigger_enum_type(C, base_type, ctype);
			} else
				base_type = &C->S->bad_ctype;
			parent->ctype.base_type = base_type;
		}
		if (dmrC_is_int_type(C->S, base_type)) {
			Num v = {.y = lastval};
			if (ctype->ctype.modifiers & MOD_UNSIGNED)
				v.x = 0;
			else if ((long long)lastval >= 0)
				v.x = 0;
			else
				v.x = -1;
			upper_boundary(&upper, &v);
			lower_boundary(&lower, &v);
		}
		token = next;

		sym->endpos = token->pos;

		if (!dmrC_match_op(token, ','))
			break;
		token = token->next;
	}
	if (!base_type) {
		dmrC_sparse_error(C, token->pos, "bad enum definition");
		base_type = &C->S->bad_ctype;
	}
	else if (!dmrC_is_int_type(C->S, base_type))
                ; //base_type = base_type;
	else if (type_is_ok(C, base_type, &upper, &lower))
                ; //base_type = base_type;
	else if (type_is_ok(C, &C->S->int_ctype, &upper, &lower))
		base_type = &C->S->int_ctype;
	else if (type_is_ok(C, &C->S->uint_ctype, &upper, &lower))
		base_type = &C->S->uint_ctype;
	else if (type_is_ok(C, &C->S->long_ctype, &upper, &lower))
		base_type = &C->S->long_ctype;
	else if (type_is_ok(C, &C->S->ulong_ctype, &upper, &lower))
		base_type = &C->S->ulong_ctype;
	else if (type_is_ok(C, &C->S->llong_ctype, &upper, &lower))
		base_type = &C->S->llong_ctype;
	else if (type_is_ok(C, &C->S->ullong_ctype, &upper, &lower))
		base_type = &C->S->ullong_ctype;
	else
		base_type = &C->S->bad_ctype;
	parent->ctype.base_type = base_type;
	parent->ctype.modifiers |= (base_type->ctype.modifiers & MOD_UNSIGNED);
	parent->examined = 0;

	cast_enum_list(C, parent->symbol_list, base_type);

	return token;
}